

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

int google::protobuf::internal::TcParser::FieldNumber(TcParseTableBase *table,FieldEntry *entry)

{
  bool bVar1;
  FieldEntry *pFVar2;
  ushort *puVar3;
  int *piVar4;
  _Optional_payload_base<int> local_50;
  optional<int> number_1;
  uint16_t i;
  uint16_t num_skip_entries;
  uint32_t fstart;
  uint16_t *lookup_table;
  optional<int> number;
  anon_class_8_1_c08dfc18 visit_bitmap;
  size_t need_to_skip;
  FieldEntry *entry_local;
  TcParseTableBase *table_local;
  
  pFVar2 = TcParseTableBase::field_entries_begin(table);
  visit_bitmap.need_to_skip = (size_t *)(((long)entry - (long)pFVar2) / 0xc);
  number.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int> =
       (_Optional_base<int,_true,_true>)&visit_bitmap;
  lookup_table = (uint16_t *)
                 FieldNumber::anon_class_8_1_c08dfc18::operator()
                           ((anon_class_8_1_c08dfc18 *)&number,table->skipmap32 ^ 0xffffffff,1);
  bVar1 = std::optional::operator_cast_to_bool((optional *)&lookup_table);
  if (bVar1) {
    piVar4 = std::optional<int>::operator*((optional<int> *)&lookup_table);
    return *piVar4;
  }
  _i = TcParseTableBase::field_lookup_begin(table);
  while( true ) {
    bVar1 = true;
    if (*_i == 0xffff) {
      bVar1 = _i[1] != 0xffff;
    }
    if (!bVar1) break;
    number_1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
    _4_4_ = *(undefined4 *)_i;
    puVar3 = _i + 2;
    _i = _i + 3;
    number_1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
    _M_payload._M_value._2_2_ = *puVar3;
    for (number_1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>
         ._M_payload._M_value._0_2_ = 0;
        (ushort)number_1.super__Optional_base<int,_true,_true>._M_payload.
                super__Optional_payload_base<int>._M_payload._M_value._0_2_ <
        (ushort)number_1.super__Optional_base<int,_true,_true>._M_payload.
                super__Optional_payload_base<int>._M_payload._M_value._2_2_;
        number_1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
        _M_payload._M_value._0_2_ =
             number_1.super__Optional_base<int,_true,_true>._M_payload.
             super__Optional_payload_base<int>._M_payload._M_value._0_2_ + 1) {
      local_50 = (_Optional_payload_base<int>)
                 FieldNumber::anon_class_8_1_c08dfc18::operator()
                           ((anon_class_8_1_c08dfc18 *)&number,(uint)(*_i ^ 0xffff),
                            number_1.super__Optional_base<int,_true,_true>._M_payload.
                            super__Optional_payload_base<int>._4_4_ +
                            (uint)(ushort)number_1.super__Optional_base<int,_true,_true>._M_payload.
                                          super__Optional_payload_base<int>._M_payload._M_value.
                                          _0_2_ * 0x10);
      bVar1 = std::optional::operator_cast_to_bool((optional *)&local_50);
      if (bVar1) {
        piVar4 = std::optional<int>::operator*((optional<int> *)&local_50);
        return *piVar4;
      }
      _i = _i + 2;
    }
  }
  Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
              ,0x17c);
}

Assistant:

int TcParser::FieldNumber(const TcParseTableBase* table,
                          const TcParseTableBase::FieldEntry* entry) {
  // The data structure was not designed to be queried in this direction, so
  // we have to do a linear search over the entries to see which one matches
  // while keeping track of the field number.
  // But it is fine because we are only using this for debug check messages.
  size_t need_to_skip = entry - table->field_entries_begin();
  const auto visit_bitmap = [&](uint32_t field_bitmap,
                                int base_field_number) -> absl::optional<int> {
    for (; field_bitmap != 0; field_bitmap &= field_bitmap - 1) {
      if (need_to_skip == 0) {
        return absl::countr_zero(field_bitmap) + base_field_number;
      }
      --need_to_skip;
    }
    return absl::nullopt;
  };
  if (auto number = visit_bitmap(~table->skipmap32, 1)) {
    return *number;
  }

  for (const uint16_t* lookup_table = table->field_lookup_begin();
       lookup_table[0] != 0xFFFF || lookup_table[1] != 0xFFFF;) {
    uint32_t fstart = lookup_table[0] | (lookup_table[1] << 16);
    lookup_table += 2;
    const uint16_t num_skip_entries = *lookup_table++;
    for (uint16_t i = 0; i < num_skip_entries; ++i) {
      // for each group of 16 fields we have: a
      // bitmap of 16 bits a 16-bit field-entry
      // offset for the first of them.
      if (auto number = visit_bitmap(static_cast<uint16_t>(~*lookup_table),
                                     fstart + 16 * i)) {
        return *number;
      }
      lookup_table += 2;
    }
  }
  Unreachable();
}